

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare_tests.c
# Opt level: O0

cJSON_bool compare_from_string(char *a,char *b,cJSON_bool case_sensitive)

{
  cJSON_bool cVar1;
  cJSON *a_00;
  cJSON *b_00;
  cJSON_bool result;
  cJSON *b_json;
  cJSON *a_json;
  cJSON_bool case_sensitive_local;
  char *b_local;
  char *a_local;
  
  a_00 = cJSON_Parse(a);
  if (a_00 == (cJSON *)0x0) {
    UnityFail("Failed to parse a.",0x22);
  }
  b_00 = cJSON_Parse(b);
  if (b_00 == (cJSON *)0x0) {
    UnityFail("Failed to parse b.",0x24);
  }
  cVar1 = cJSON_Compare(a_00,b_00,case_sensitive);
  cJSON_Delete(a_00);
  cJSON_Delete(b_00);
  return cVar1;
}

Assistant:

static cJSON_bool compare_from_string(const char * const a, const char * const b, const cJSON_bool case_sensitive)
{
    cJSON *a_json = NULL;
    cJSON *b_json = NULL;
    cJSON_bool result = false;

    a_json = cJSON_Parse(a);
    TEST_ASSERT_NOT_NULL_MESSAGE(a_json, "Failed to parse a.");
    b_json = cJSON_Parse(b);
    TEST_ASSERT_NOT_NULL_MESSAGE(b_json, "Failed to parse b.");

    result = cJSON_Compare(a_json, b_json, case_sensitive);

    cJSON_Delete(a_json);
    cJSON_Delete(b_json);

    return result;
}